

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O0

Var __thiscall
Js::JSONStringifier::ReadValue
          (JSONStringifier *this,JavascriptString *key,PropertyRecord *propertyRecord,
          RecyclableObject *holder)

{
  bool bVar1;
  uint32 index;
  PropertyId propertyId;
  PolymorphicInlineCache *polymorphicInlineCache;
  PropertyString *local_a0;
  PropertyString *propertyString;
  PropertyValueInfo info;
  Var value;
  RecyclableObject *holder_local;
  PropertyRecord *propertyRecord_local;
  JavascriptString *key_local;
  JSONStringifier *this_local;
  JavascriptString *local_10;
  
  info.inlineCacheIndex = 0;
  info.isFunctionPIC = false;
  info.allowResizingPolymorphicInlineCache = false;
  info._62_2_ = 0;
  holder_local = (RecyclableObject *)propertyRecord;
  propertyRecord_local = (PropertyRecord *)key;
  key_local = (JavascriptString *)this;
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&propertyString);
  if (holder_local == (RecyclableObject *)0x0) {
    (*(propertyRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x61])(propertyRecord_local,&holder_local,0);
  }
  bVar1 = PropertyRecord::IsNumeric((PropertyRecord *)holder_local);
  if (bVar1) {
    index = PropertyRecord::GetNumericValue((PropertyRecord *)holder_local);
    Js::JavascriptOperators::GetItem(holder,index,(Var *)&info.inlineCacheIndex,this->scriptContext)
    ;
  }
  else {
    local_10 = (JavascriptString *)propertyRecord_local;
    bVar1 = VarIs<Js::PropertyString,Js::JavascriptString>((JavascriptString *)propertyRecord_local)
    ;
    if (bVar1) {
      local_a0 = UnsafeVarTo<Js::PropertyString,Js::JavascriptString>(local_10);
    }
    else {
      local_a0 = (PropertyString *)0x0;
    }
    if (local_a0 != (PropertyString *)0x0) {
      polymorphicInlineCache = PropertyString::GetLdElemInlineCache(local_a0);
      PropertyValueInfo::SetCacheInfo<Js::PropertyString>
                ((PropertyValueInfo *)&propertyString,local_a0,polymorphicInlineCache,false);
      bVar1 = PropertyString::TryGetPropertyFromCache<false,false>
                        (local_a0,holder,holder,(Var *)&info.inlineCacheIndex,this->scriptContext,
                         (PropertyValueInfo *)&propertyString);
      if (bVar1) {
        return (Var)info._56_8_;
      }
    }
    propertyId = PropertyRecord::GetPropertyId((PropertyRecord *)holder_local);
    Js::JavascriptOperators::GetProperty
              (holder,propertyId,(Var *)&info.inlineCacheIndex,this->scriptContext,
               (PropertyValueInfo *)&propertyString);
  }
  return (Var)info._56_8_;
}

Assistant:

_Ret_notnull_ Var
JSONStringifier::ReadValue(_In_ JavascriptString* key, _In_opt_ const PropertyRecord* propertyRecord, _In_ RecyclableObject* holder)
{
    Var value = nullptr;
    PropertyValueInfo info;

    if (propertyRecord == nullptr)
    {
        key->GetPropertyRecord(&propertyRecord);
    }

    if (propertyRecord->IsNumeric())
    {
        JavascriptOperators::GetItem(holder, propertyRecord->GetNumericValue(), &value, this->scriptContext);
    }
    else
    {
        PropertyString* propertyString = JavascriptOperators::TryFromVar<PropertyString>(key);
        if (propertyString != nullptr)
        {
            PropertyValueInfo::SetCacheInfo(&info, propertyString, propertyString->GetLdElemInlineCache(), false);
            if (propertyString->TryGetPropertyFromCache<false /* ownPropertyOnly */, false /* OutputExistence */>(holder, holder, &value, this->scriptContext, &info))
            {
                return value;
            }
        }
        JavascriptOperators::GetProperty(holder, propertyRecord->GetPropertyId(), &value, this->scriptContext, &info);
    }

    return value;
}